

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O0

bool __thiscall DataRefs::SaveConfigFile(DataRefs *this)

{
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  logLevelTy lVar4;
  ostream *poVar5;
  string *psVar6;
  ulong uVar7;
  size_type sVar8;
  undefined8 uVar9;
  DataRefs *in_RDI;
  char sErr_1 [100];
  CSLPathCfgTy *cslPath;
  iterator __end2_1;
  iterator __begin2_1;
  vecCSLPaths *__range2_1;
  string *s;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  size_t i;
  dataRefDefinitionT *def;
  dataRefDefinitionT *__end1;
  dataRefDefinitionT *__begin1;
  dataRefDefinitionT (*__range1) [111];
  char sErr [100];
  ofstream fOut;
  string sFileName;
  vector<DataRefs::CSLPathCfgTy,_std::allocator<DataRefs::CSLPathCfgTy>_> *in_stack_fffffffffffff988
  ;
  undefined4 in_stack_fffffffffffff990;
  undefined4 in_stack_fffffffffffff994;
  undefined4 uVar10;
  vector<DataRefs::CSLPathCfgTy,_std::allocator<DataRefs::CSLPathCfgTy>_> *in_stack_fffffffffffff9a0
  ;
  string *in_stack_fffffffffffff9a8;
  ostream *in_stack_fffffffffffff9b0;
  char *pcVar11;
  allocator<char> *in_stack_fffffffffffff9c0;
  string *in_stack_fffffffffffff9c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9d0;
  dataRefDefinitionT *in_stack_fffffffffffffa48;
  undefined1 local_458 [112];
  reference local_3e8;
  CSLPathCfgTy *local_3e0;
  __normal_iterator<DataRefs::CSLPathCfgTy_*,_std::vector<DataRefs::CSLPathCfgTy,_std::allocator<DataRefs::CSLPathCfgTy>_>_>
  local_3d8;
  vecCSLPaths *local_3d0;
  reference local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3c0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3b8;
  reference local_3b0;
  ulong local_3a8;
  string local_3a0 [32];
  string local_380 [8];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  dataRefDefinitionT *local_300;
  dataRefDefinitionT *local_2f8;
  dataRefDefinitionT *local_2f0;
  dataRefDefinitionT *local_2e8;
  undefined4 local_2dc;
  undefined1 local_2d8 [112];
  long local_268 [66];
  allocator<char> local_51;
  string local_50 [32];
  string local_30 [47];
  byte local_1;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff9d0,(char *)in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
  LTCalcFullPath(in_stack_fffffffffffff9a8);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  _Var3 = std::operator|(_S_out,_S_trunc);
  std::ofstream::ofstream(local_268,local_30,_Var3);
  bVar1 = std::ios::operator!((ios *)((long)local_268 + *(long *)(local_268[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)local_268,"LiveTraffic");
    poVar5 = std::operator<<(poVar5,' ');
    poVar5 = std::operator<<(poVar5,LT_VERSION);
    std::operator<<(poVar5,'\n');
    local_2e8 = DATA_REFS_LT;
    local_2f8 = (dataRefDefinitionT *)&LTGetBulkAc::size_quick;
    for (local_2f0 = DATA_REFS_LT; local_2f0 != local_2f8; local_2f0 = local_2f0 + 1) {
      local_300 = local_2f0;
      bVar2 = dataRefDefinitionT::isCfgFile(local_2f0);
      if (bVar2) {
        dataRefDefinitionT::GetConfigString_abi_cxx11_(in_stack_fffffffffffffa48);
        poVar5 = std::operator<<((ostream *)local_268,local_320);
        std::operator<<(poVar5,'\n');
        std::__cxx11::string::~string(local_320);
      }
    }
    poVar5 = std::operator<<((ostream *)local_268,"MessageWndPos");
    std::operator<<(poVar5,' ');
    poVar5 = operator<<(in_stack_fffffffffffff9b0,(WndRect *)in_stack_fffffffffffff9a8);
    std::operator<<(poVar5,'\n');
    poVar5 = std::operator<<((ostream *)local_268,"SettingsWndPos");
    std::operator<<(poVar5,' ');
    poVar5 = operator<<(in_stack_fffffffffffff9b0,(WndRect *)in_stack_fffffffffffff9a8);
    std::operator<<(poVar5,'\n');
    poVar5 = std::operator<<((ostream *)local_268,"ACInfoWndPos");
    std::operator<<(poVar5,' ');
    poVar5 = operator<<(in_stack_fffffffffffff9b0,(WndRect *)in_stack_fffffffffffff9a8);
    std::operator<<(poVar5,'\n');
    poVar5 = std::operator<<((ostream *)local_268,"InfoListWndPos");
    std::operator<<(poVar5,' ');
    poVar5 = operator<<(in_stack_fffffffffffff9b0,(WndRect *)in_stack_fffffffffffff9a8);
    std::operator<<(poVar5,'\n');
    poVar5 = std::operator<<((ostream *)local_268,"DEFAULT_AC_TYPE");
    poVar5 = std::operator<<(poVar5,' ');
    psVar6 = GetDefaultAcIcaoType_abi_cxx11_(in_RDI);
    poVar5 = std::operator<<(poVar5,(string *)psVar6);
    std::operator<<(poVar5,'\n');
    poVar5 = std::operator<<((ostream *)local_268,"DEFAULT_CAR_TYPE");
    poVar5 = std::operator<<(poVar5,' ');
    psVar6 = GetDefaultCarIcaoType_abi_cxx11_(in_RDI);
    poVar5 = std::operator<<(poVar5,(string *)psVar6);
    std::operator<<(poVar5,'\n');
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      poVar5 = std::operator<<((ostream *)local_268,"OpenSky_User");
      poVar5 = std::operator<<(poVar5,' ');
      poVar5 = std::operator<<(poVar5,(string *)&in_RDI->sOpenSkyUser);
      std::operator<<(poVar5,'\n');
    }
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      poVar5 = std::operator<<((ostream *)local_268,"OpenSky_Pwd");
      poVar5 = std::operator<<(poVar5,' ');
      Obfuscate(in_stack_fffffffffffff9c8);
      poVar5 = std::operator<<(poVar5,local_340);
      std::operator<<(poVar5,'\n');
      std::__cxx11::string::~string(local_340);
    }
    GetADSBExAPIKey_abi_cxx11_(in_RDI);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      poVar5 = std::operator<<((ostream *)local_268,"ADSBEX_API_KEY");
      poVar5 = std::operator<<(poVar5,' ');
      GetADSBExAPIKey_abi_cxx11_(in_RDI);
      Obfuscate(in_stack_fffffffffffff9c8);
      poVar5 = std::operator<<(poVar5,local_360);
      std::operator<<(poVar5,'\n');
      std::__cxx11::string::~string(local_360);
    }
    GetRTLicense_abi_cxx11_(in_RDI);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      poVar5 = std::operator<<((ostream *)local_268,"RealTraffic_License");
      poVar5 = std::operator<<(poVar5,' ');
      GetRTLicense_abi_cxx11_(in_RDI);
      Obfuscate(in_stack_fffffffffffff9c8);
      poVar5 = std::operator<<(poVar5,local_380);
      std::operator<<(poVar5,'\n');
      std::__cxx11::string::~string(local_380);
    }
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      poVar5 = std::operator<<((ostream *)local_268,"FSC_User");
      poVar5 = std::operator<<(poVar5,' ');
      poVar5 = std::operator<<(poVar5,(string *)&in_RDI->sFSCUser);
      std::operator<<(poVar5,'\n');
    }
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      poVar5 = std::operator<<((ostream *)local_268,"FSC_Pwd");
      poVar5 = std::operator<<(poVar5,' ');
      Obfuscate(in_stack_fffffffffffff9c8);
      poVar5 = std::operator<<(poVar5,local_3a0);
      std::operator<<(poVar5,'\n');
      std::__cxx11::string::~string(local_3a0);
    }
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      poVar5 = std::operator<<((ostream *)local_268,"SI_DisplayName");
      poVar5 = std::operator<<(poVar5,' ');
      poVar5 = std::operator<<(poVar5,(string *)&in_RDI->sSIDisplayName);
      std::operator<<(poVar5,'\n');
    }
    poVar5 = std::operator<<((ostream *)local_268,'\n');
    poVar5 = std::operator<<(poVar5,"[FlarmAcTypes]");
    std::operator<<(poVar5,'\n');
    for (local_3a8 = 0; uVar7 = local_3a8,
        sVar8 = std::
                array<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_14UL>
                ::size(&dataRefs.aFlarmToIcaoAcTy), uVar7 < sVar8; local_3a8 = local_3a8 + 1) {
      poVar5 = (ostream *)std::ostream::operator<<(local_268,local_3a8);
      std::operator<<(poVar5," =");
      local_3b0 = std::
                  array<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_14UL>
                  ::operator[]((array<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_14UL>
                                *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                               (size_type)in_stack_fffffffffffff988);
      local_3b8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffff988);
      local_3c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff988);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffff988), bVar2) {
        local_3c8 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_3b8);
        poVar5 = std::operator<<((ostream *)local_268,' ');
        std::operator<<(poVar5,(string *)local_3c8);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_3b8);
      }
      std::operator<<((ostream *)local_268,'\n');
    }
    bVar2 = std::vector<DataRefs::CSLPathCfgTy,_std::allocator<DataRefs::CSLPathCfgTy>_>::empty
                      (in_stack_fffffffffffff9a0);
    if (!bVar2) {
      poVar5 = std::operator<<((ostream *)local_268,'\n');
      poVar5 = std::operator<<(poVar5,"[CSLPaths]");
      std::operator<<(poVar5,'\n');
      local_3d0 = &in_RDI->vCSLPaths;
      local_3d8._M_current =
           (CSLPathCfgTy *)
           std::vector<DataRefs::CSLPathCfgTy,_std::allocator<DataRefs::CSLPathCfgTy>_>::begin
                     (in_stack_fffffffffffff988);
      local_3e0 = (CSLPathCfgTy *)
                  std::vector<DataRefs::CSLPathCfgTy,_std::allocator<DataRefs::CSLPathCfgTy>_>::end
                            (in_stack_fffffffffffff988);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<DataRefs::CSLPathCfgTy_*,_std::vector<DataRefs::CSLPathCfgTy,_std::allocator<DataRefs::CSLPathCfgTy>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                                (__normal_iterator<DataRefs::CSLPathCfgTy_*,_std::vector<DataRefs::CSLPathCfgTy,_std::allocator<DataRefs::CSLPathCfgTy>_>_>
                                 *)in_stack_fffffffffffff988), bVar2) {
        local_3e8 = __gnu_cxx::
                    __normal_iterator<DataRefs::CSLPathCfgTy_*,_std::vector<DataRefs::CSLPathCfgTy,_std::allocator<DataRefs::CSLPathCfgTy>_>_>
                    ::operator*(&local_3d8);
        bVar2 = CSLPathCfgTy::empty((CSLPathCfgTy *)0x13b5dd);
        if (!bVar2) {
          bVar2 = CSLPathCfgTy::enabled
                            ((CSLPathCfgTy *)
                             CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
          if (bVar2) {
            pcVar11 = "1|";
          }
          else {
            pcVar11 = "0|";
          }
          poVar5 = std::operator<<((ostream *)local_268,pcVar11);
          psVar6 = CSLPathCfgTy::getPath_abi_cxx11_(local_3e8);
          poVar5 = std::operator<<(poVar5,(string *)psVar6);
          std::operator<<(poVar5,'\n');
        }
        __gnu_cxx::
        __normal_iterator<DataRefs::CSLPathCfgTy_*,_std::vector<DataRefs::CSLPathCfgTy,_std::allocator<DataRefs::CSLPathCfgTy>_>_>
        ::operator++(&local_3d8);
      }
    }
    bVar1 = std::ios::operator!((ios *)((long)local_268 + *(long *)(local_268[0] + -0x18)));
    uVar10 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff994);
    if ((bVar1 & 1) == 0) {
      std::ostream::flush();
      std::ofstream::close();
      local_1 = 1;
    }
    else {
      __errno_location();
      strerror_s((char *)CONCAT44(uVar10,in_stack_fffffffffffff990),
                 (size_t)in_stack_fffffffffffff988,0);
      lVar4 = GetLogLevel(&dataRefs);
      if ((int)lVar4 < 4) {
        uVar9 = std::__cxx11::string::c_str();
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/DataRefs.cpp"
               ,0x95b,"SaveConfigFile",logERR,"Could not write into config file \'%s\': %s",uVar9,
               local_458);
      }
      uVar9 = std::__cxx11::string::c_str();
      CreateMsgWindow(12.0,logERR,"Could not write into config file \'%s\': %s",uVar9,local_458);
      std::ofstream::close();
      local_1 = 0;
    }
  }
  else {
    __errno_location();
    strerror_s((char *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
               (size_t)in_stack_fffffffffffff988,0);
    lVar4 = GetLogLevel(&dataRefs);
    if ((int)lVar4 < 4) {
      uVar9 = std::__cxx11::string::c_str();
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/DataRefs.cpp"
             ,0x91d,"SaveConfigFile",logERR,"Could not create config file \'%s\': %s",uVar9,
             local_2d8);
    }
    uVar9 = std::__cxx11::string::c_str();
    CreateMsgWindow(12.0,logERR,"Could not create config file \'%s\': %s",uVar9,local_2d8);
    local_1 = 0;
  }
  local_2dc = 1;
  std::ofstream::~ofstream(local_268);
  std::__cxx11::string::~string(local_30);
  return (bool)(local_1 & 1);
}

Assistant:

bool DataRefs::SaveConfigFile()
{
    // open an output config file
    std::string sFileName (LTCalcFullPath(PATH_CONFIG_FILE));
    std::ofstream fOut (sFileName, std::ios_base::out | std::ios_base::trunc);
    if (!fOut) {
		char sErr[SERR_LEN];
		strerror_s(sErr, sizeof(sErr), errno);
		SHOW_MSG(logERR, ERR_CFG_FILE_OPEN_OUT,
                 sFileName.c_str(), sErr);
        return false;
    }
    
    // *** VERSION ***
    // save application and version first
    fOut << LIVE_TRAFFIC << ' ' << LT_VERSION << '\n';
    
    // *** DataRefs ***
    // loop over our LiveTraffic values and store those meant to be stored
    for (const DataRefs::dataRefDefinitionT& def: DATA_REFS_LT)
        if (def.isCfgFile())                   // only for values which are to be saved
            fOut << def.GetConfigString() << '\n';
    
    // *** Window positions ***
    fOut << CFG_WNDPOS_MSG << ' ' << MsgRect << '\n';
    fOut << CFG_WNDPOS_SUI << ' ' << SUIrect << '\n';
    fOut << CFG_WNDPOS_ACI << ' ' << ACIrect << '\n';
    fOut << CFG_WNDPOS_ILW << ' ' << ILWrect << '\n';
    
    // *** Strings ***
    fOut << CFG_DEFAULT_AC_TYPE << ' ' << GetDefaultAcIcaoType() << '\n';
    fOut << CFG_DEFAULT_CAR_TYPE << ' ' << GetDefaultCarIcaoType() << '\n';
    if (!sOpenSkyUser.empty())
        fOut << CFG_OPENSKY_USER << ' ' << sOpenSkyUser << '\n';
    if (!sOpenSkyPwd.empty())
        fOut << CFG_OPENSKY_PWD << ' ' << Obfuscate(sOpenSkyPwd) << '\n';
    if (!GetADSBExAPIKey().empty())
        fOut << CFG_ADSBEX_API_KEY << ' ' << Obfuscate(GetADSBExAPIKey()) << '\n';
    if (!GetRTLicense().empty())
        fOut << CFG_RT_LICENSE << ' ' << Obfuscate(GetRTLicense()) << '\n';
    if (!sFSCUser.empty())
        fOut << CFG_FSC_USER << ' ' << sFSCUser << '\n';
    if (!sFSCPwd.empty())
        fOut << CFG_FSC_PWD << ' ' << Obfuscate(sFSCPwd) << '\n';
    if (!sSIDisplayName.empty())
        fOut << CFG_SI_DISPLAYNAME << ' ' << sSIDisplayName << '\n';

    // *** [FlarmAcTypes] ***
    fOut << '\n' << CFG_FLARM_ACTY_SECTION << '\n';
    for (size_t i = 0; i < dataRefs.aFlarmToIcaoAcTy.size(); i++) {
        fOut << i << " =";
        for (const std::string& s: dataRefs.aFlarmToIcaoAcTy[i])
            fOut << ' ' << s;
        fOut << '\n';
    }

    // *** [CSLPatchs] ***
    // add section of CSL paths to the end
    if (!vCSLPaths.empty()) {
        fOut << '\n' << CFG_CSL_SECTION << '\n';
        for (const DataRefs::CSLPathCfgTy& cslPath: vCSLPaths)
            if (!cslPath.empty())
                fOut << (cslPath.enabled() ? "1|" : "0|") <<
                cslPath.getPath() << '\n';
    }
    
    // some error checking towards the end
    if (!fOut) {
        char sErr[SERR_LEN];
        strerror_s(sErr, sizeof(sErr), errno);
        SHOW_MSG(logERR, ERR_CFG_FILE_WRITE,
                 sFileName.c_str(), sErr);
        fOut.close();
        return false;
    }

    // flush (which we explicitely did not do for each line for performance reasons) and close
    fOut.flush();
    fOut.close();
        
    return true;
}